

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_3::DBIter::Seek(DBIter *this,Slice *target)

{
  int iVar1;
  ParsedInternalKey local_38;
  
  this->direction_ = kForward;
  ClearSavedValue(this);
  (this->saved_key_)._M_string_length = 0;
  *(this->saved_key_)._M_dataplus._M_p = '\0';
  local_38.user_key.data_ = target->data_;
  local_38.user_key.size_ = target->size_;
  local_38.sequence = this->sequence_;
  local_38.type = kTypeValue;
  AppendInternalKey(&this->saved_key_,&local_38);
  local_38.user_key.data_ = (this->saved_key_)._M_dataplus._M_p;
  local_38.user_key.size_ = (this->saved_key_)._M_string_length;
  (*this->iter_->_vptr_Iterator[5])();
  iVar1 = (*this->iter_->_vptr_Iterator[2])();
  if ((char)iVar1 == '\0') {
    this->valid_ = false;
  }
  else {
    FindNextUserEntry(this,false,&this->saved_key_);
  }
  return;
}

Assistant:

void DBIter::Seek(const Slice &target) {
            direction_ = kForward;
            ClearSavedValue();
            saved_key_.clear();
            AppendInternalKey(
                    &saved_key_, ParsedInternalKey(target, sequence_, kValueTypeForSeek));
            iter_->Seek(saved_key_);
            if (iter_->Valid()) {
                FindNextUserEntry(false, &saved_key_ /* temporary storage */);
            } else {
                valid_ = false;
            }
        }